

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O2

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  FSE_DTable *pFVar1;
  uchar *puVar2;
  uchar uVar3;
  BIT_DStream_status BVar4;
  size_t sVar5;
  size_t sVar6;
  FSE_DState_t *pFVar7;
  uchar *puVar8;
  long lVar9;
  long lVar10;
  uint maxSymbolValue;
  uint tableLog;
  FSE_DTable *local_88;
  FSE_DState_t state1;
  FSE_DState_t local_68;
  BIT_DStream_t bitD;
  
  maxSymbolValue = 0xff;
  if (wkspSize < 0x204) {
    sVar6 = 0xffffffffffffffff;
  }
  else {
    sVar5 = FSE_readNCount_bmi2((short *)workSpace,&maxSymbolValue,&tableLog,cSrc,cSrcSize,0);
    sVar6 = sVar5;
    if (((sVar5 < 0xffffffffffffff89) && (sVar6 = 0xffffffffffffffd4, tableLog <= maxLog)) &&
       (lVar9 = (long)(1 << ((byte)tableLog & 0x1f)),
       ((1L << ((byte)tableLog & 0x3f)) + lVar9 * 4 + (ulong)(maxSymbolValue + 1) * 2 + 0xf &
       0xfffffffffffffffc) + 0x204 <= wkspSize)) {
      pFVar1 = (FSE_DTable *)((long)workSpace + 0x200);
      sVar6 = FSE_buildDTable_internal
                        (pFVar1,(short *)workSpace,maxSymbolValue,tableLog,
                         (void *)((lVar9 + 1) * 4 + 0x200 + (long)workSpace),
                         (wkspSize - (lVar9 * 4 + 4)) - 0x204);
      if (sVar6 < 0xffffffffffffff89) {
        puVar2 = (uchar *)((long)dst + (dstCapacity - 3));
        local_88 = pFVar1;
        if (*(short *)((long)workSpace + 0x202) == 0) {
          sVar6 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar5),cSrcSize - sVar5);
          pFVar1 = local_88;
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
          FSE_initDState(&state1,&bitD,local_88);
          FSE_initDState(&local_68,&bitD,pFVar1);
          lVar9 = 0;
          while( true ) {
            puVar8 = (uchar *)((long)dst + lVar9);
            BVar4 = BIT_reloadDStream(&bitD);
            if ((puVar2 <= puVar8) || (BVar4 != BIT_DStream_unfinished)) break;
            uVar3 = FSE_decodeSymbol(&state1,&bitD);
            *puVar8 = uVar3;
            uVar3 = FSE_decodeSymbol(&local_68,&bitD);
            puVar8[1] = uVar3;
            uVar3 = FSE_decodeSymbol(&state1,&bitD);
            puVar8[2] = uVar3;
            uVar3 = FSE_decodeSymbol(&local_68,&bitD);
            puVar8[3] = uVar3;
            lVar9 = lVar9 + 4;
          }
          puVar2 = (uchar *)((long)dst + (dstCapacity - 2));
          pFVar7 = &local_68;
          do {
            lVar10 = lVar9;
            if (puVar2 < (uchar *)(lVar10 + (long)dst)) {
              return 0xffffffffffffffba;
            }
            uVar3 = FSE_decodeSymbol(&state1,&bitD);
            puVar8 = (uchar *)(lVar10 + (long)dst) + 1;
            *(uchar *)(lVar10 + (long)dst) = uVar3;
            BVar4 = BIT_reloadDStream(&bitD);
            if (BVar4 == BIT_DStream_overflow) {
              lVar9 = 2;
              goto LAB_00201b2e;
            }
            if (puVar2 < puVar8) {
              return 0xffffffffffffffba;
            }
            uVar3 = FSE_decodeSymbol(pFVar7,&bitD);
            *puVar8 = uVar3;
            BVar4 = BIT_reloadDStream(&bitD);
            lVar9 = lVar10 + 2;
          } while (BVar4 != BIT_DStream_overflow);
          puVar8 = (uchar *)((long)dst + lVar10 + 2);
          lVar9 = 3;
          pFVar7 = &state1;
LAB_00201b2e:
          uVar3 = FSE_decodeSymbol(pFVar7,&bitD);
        }
        else {
          sVar6 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar5),cSrcSize - sVar5);
          pFVar1 = local_88;
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
          FSE_initDState(&state1,&bitD,local_88);
          FSE_initDState(&local_68,&bitD,pFVar1);
          lVar9 = 0;
          while( true ) {
            puVar8 = (uchar *)((long)dst + lVar9);
            BVar4 = BIT_reloadDStream(&bitD);
            if ((puVar2 <= puVar8) || (BVar4 != BIT_DStream_unfinished)) break;
            uVar3 = FSE_decodeSymbolFast(&state1,&bitD);
            *puVar8 = uVar3;
            uVar3 = FSE_decodeSymbolFast(&local_68,&bitD);
            puVar8[1] = uVar3;
            uVar3 = FSE_decodeSymbolFast(&state1,&bitD);
            puVar8[2] = uVar3;
            uVar3 = FSE_decodeSymbolFast(&local_68,&bitD);
            puVar8[3] = uVar3;
            lVar9 = lVar9 + 4;
          }
          puVar2 = (uchar *)((long)dst + (dstCapacity - 2));
          pFVar7 = &local_68;
          do {
            lVar10 = lVar9;
            if (puVar2 < (uchar *)(lVar10 + (long)dst)) {
              return 0xffffffffffffffba;
            }
            uVar3 = FSE_decodeSymbolFast(&state1,&bitD);
            puVar8 = (uchar *)(lVar10 + (long)dst) + 1;
            *(uchar *)(lVar10 + (long)dst) = uVar3;
            BVar4 = BIT_reloadDStream(&bitD);
            if (BVar4 == BIT_DStream_overflow) {
              lVar9 = 2;
              goto LAB_00201b1b;
            }
            if (puVar2 < puVar8) {
              return 0xffffffffffffffba;
            }
            uVar3 = FSE_decodeSymbolFast(pFVar7,&bitD);
            *puVar8 = uVar3;
            BVar4 = BIT_reloadDStream(&bitD);
            lVar9 = lVar10 + 2;
          } while (BVar4 != BIT_DStream_overflow);
          puVar8 = (uchar *)((long)dst + lVar10 + 2);
          lVar9 = 3;
          pFVar7 = &state1;
LAB_00201b1b:
          uVar3 = FSE_decodeSymbolFast(pFVar7,&bitD);
        }
        *puVar8 = uVar3;
        sVar6 = lVar9 + lVar10;
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}